

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_FRC(Context *ctx)

{
  int iVar1;
  DestArgInfo *dst;
  Context *ctx_local;
  
  if (((ctx->dest_arg).result_mod & 1U) == 0) {
    iVar1 = shader_version_atleast(ctx,'\x02','\0');
    if (((iVar1 == 0) && (iVar1 = writemask_y((ctx->dest_arg).writemask), iVar1 == 0)) &&
       (iVar1 = writemask_xy((ctx->dest_arg).writemask), iVar1 == 0)) {
      fail(ctx,"FRC writemask must be .y or .xy for shader model 1.x");
    }
  }
  else {
    fail(ctx,"FRC destination can\'t use saturate modifier");
  }
  return;
}

Assistant:

static void state_FRC(Context *ctx)
{
    const DestArgInfo *dst = &ctx->dest_arg;

    if (dst->result_mod & MOD_SATURATE)  // according to msdn...
        fail(ctx, "FRC destination can't use saturate modifier");

    else if (!shader_version_atleast(ctx, 2, 0))
    {
        if (!writemask_y(dst->writemask) && !writemask_xy(dst->writemask))
            fail(ctx, "FRC writemask must be .y or .xy for shader model 1.x");
    } // else if
}